

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

unsigned_long_long QUtil::string_to_ull(char *str)

{
  runtime_error *prVar1;
  int *piVar2;
  bool local_fb;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulonglong local_98;
  unsigned_long_long result;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *p;
  char *str_local;
  
  local_18 = str;
  p = str;
  while( true ) {
    local_fb = false;
    if (*local_18 != '\0') {
      local_fb = ::qpdf::util::is_space(*local_18);
    }
    if (local_fb == false) break;
    local_18 = local_18 + 1;
  }
  if (*local_18 == '-') {
    result._3_1_ = 1;
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"underflow converting ",&local_79);
    std::operator+(&local_58,&local_78,p);
    std::operator+(&local_38,&local_58," to 64-bit unsigned integer");
    std::runtime_error::runtime_error(prVar1,(string *)&local_38);
    result._3_1_ = 0;
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  local_98 = strtoull(p,(char **)0x0,10);
  piVar2 = __errno_location();
  if (*piVar2 == 0x22) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"overflow converting ",&local_f9);
    std::operator+(&local_d8,&local_f8,p);
    std::operator+(&local_b8,&local_d8," to 64-bit unsigned integer");
    std::runtime_error::runtime_error(prVar1,(string *)&local_b8);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return local_98;
}

Assistant:

unsigned long long
QUtil::string_to_ull(char const* str)
{
    char const* p = str;
    while (*p && util::is_space(*p)) {
        ++p;
    }
    if (*p == '-') {
        throw std::runtime_error(
            std::string("underflow converting ") + str + " to 64-bit unsigned integer");
    }

    errno = 0;
#ifdef _MSC_VER
    unsigned long long result = _strtoui64(str, 0, 10);
#else
    unsigned long long result = strtoull(str, nullptr, 10);
#endif
    if (errno == ERANGE) {
        throw std::runtime_error(
            std::string("overflow converting ") + str + " to 64-bit unsigned integer");
    }
    return result;
}